

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

void __thiscall
wasm::Random::FeatureOptions<wasm::HeapType>::FeatureOptions
          (FeatureOptions<wasm::HeapType> *this,FeatureOptions<wasm::HeapType> *param_1)

{
  FeatureOptions<wasm::HeapType> *param_1_local;
  FeatureOptions<wasm::HeapType> *this_local;
  
  std::
  map<wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  ::map(&this->options,&param_1->options);
  return;
}

Assistant:

FeatureOptions<T>& add(HeapType::BasicHeapType option) {
      // Using FeatureOptions with BasicHeapTypes is risky as BasicHeapType
      // is an enum, which can convert into FeatureSet implicitly (which would
      // then be ambiguous with add(FeatureSet) below). Use HeapType instead.
      //
      // Use a weird static assert on something other than |false| because of
      // https://www.open-std.org/jtc1/sc22/wg21/docs/papers/2023/p2593r1.html
      // (older compilers may error without this workaround).
      static_assert(sizeof(T) == 0);
    }